

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O2

int uv_fs_futime_ex(uv_loop_t *loop,uv_fs_t *req,uv_os_fd_t file,double btime,double atime,
                   double mtime,uv_fs_cb cb)

{
  int iVar1;
  
  if (req != (uv_fs_t *)0x0) {
    req->loop = loop;
    req->type = UV_FS;
    req->fs_type = UV_FS_FUTIME;
    req->new_path = (char *)0x0;
    req->bufs = (uv_buf_t *)0x0;
    req->path = (char *)0x0;
    req->result = 0;
    req->ptr = (void *)0x0;
    req->cb = cb;
    req->file = file;
    req->btime = btime;
    req->atime = atime;
    req->mtime = mtime;
    if (cb == (uv_fs_cb)0x0) {
      uv__fs_work(&req->work_req);
      iVar1 = (int)req->result;
    }
    else {
      (loop->active_reqs).count = (loop->active_reqs).count + 1;
      uv__work_submit(loop,&req->work_req,UV__WORK_FAST_IO,uv__fs_work,uv__fs_done);
      iVar1 = 0;
    }
    return iVar1;
  }
  return -0x16;
}

Assistant:

int uv_fs_futime_ex(uv_loop_t* loop,
                    uv_fs_t* req,
                    uv_os_fd_t file,
                    double btime,
                    double atime,
                    double mtime,
                    uv_fs_cb cb) {
  INIT(FUTIME);
  req->file = file;
  req->btime = btime;
  req->atime = atime;
  req->mtime = mtime;
  POST;
}